

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_binsl_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  sbyte sVar1;
  fpr_t *pfVar2;
  byte bVar3;
  
  pfVar2 = (env->active_fpu).fpr + wd;
  bVar3 = *(byte *)((env->active_fpu).fpr + ws);
  sVar1 = (*(byte *)((env->active_fpu).fpr + wt) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & (byte)pfVar2->fs[0];
  }
  *(byte *)pfVar2 = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) &
            (byte)*(undefined4 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) &
            (byte)*(undefined4 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) &
            (byte)*(undefined4 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = bVar3;
  bVar3 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
  sVar1 = (*(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf) & 7) + 1;
  if (sVar1 != 8) {
    bVar3 = (bVar3 >> (8U - sVar1 & 0x1f)) << (8U - sVar1 & 0x1f) |
            (byte)(0xfe >> sVar1) & *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf);
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf) = bVar3;
  return;
}

Assistant:

void helper_msa_binsl_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_binsl_df(DF_BYTE, pwd->b[0],  pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_binsl_df(DF_BYTE, pwd->b[1],  pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_binsl_df(DF_BYTE, pwd->b[2],  pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_binsl_df(DF_BYTE, pwd->b[3],  pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_binsl_df(DF_BYTE, pwd->b[4],  pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_binsl_df(DF_BYTE, pwd->b[5],  pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_binsl_df(DF_BYTE, pwd->b[6],  pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_binsl_df(DF_BYTE, pwd->b[7],  pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_binsl_df(DF_BYTE, pwd->b[8],  pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_binsl_df(DF_BYTE, pwd->b[9],  pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_binsl_df(DF_BYTE, pwd->b[10], pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_binsl_df(DF_BYTE, pwd->b[11], pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_binsl_df(DF_BYTE, pwd->b[12], pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_binsl_df(DF_BYTE, pwd->b[13], pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_binsl_df(DF_BYTE, pwd->b[14], pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_binsl_df(DF_BYTE, pwd->b[15], pws->b[15], pwt->b[15]);
}